

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

string * jetbrains::teamcity::getFlowIdFromEnvironment_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_9;
  
  __s = getenv("TEAMCITY_PROCESS_FLOW_ID");
  if (__s == (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_9);
  }
  return in_RDI;
}

Assistant:

std::string getFlowIdFromEnvironment()
{
#if defined(WIN32) || defined(_WIN32) || defined(__WIN32) && !defined(__CYGWIN__)
    char* flowId = 0;
    size_t sz = 0;
    std::string result;
    if (!_dupenv_s(&flowId, &sz, "TEAMCITY_PROCESS_FLOW_ID"))
    {
        result = flowId != 0 ? flowId : std::string();
        free(flowId);
    }

    return result;
#else
    const char* const flowId = getenv("TEAMCITY_PROCESS_FLOW_ID");
    return flowId == 0 ? std::string() : flowId;
#endif
}